

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_variant.h
# Opt level: O0

Variant * __thiscall BamTools::Variant::operator=(Variant *this,Variant *rhs)

{
  ImplBase *in_RSI;
  Variant *in_RDI;
  
  if (in_RSI->_vptr_ImplBase != (_func_int **)0x0) {
    ImplBase::AddRef((ImplBase *)in_RSI->_vptr_ImplBase);
  }
  if (in_RDI->data != (ImplBase *)0x0) {
    ImplBase::Release(in_RSI);
  }
  in_RDI->data = (ImplBase *)in_RSI->_vptr_ImplBase;
  return in_RDI;
}

Assistant:

Variant& operator=(const Variant& rhs)
    {
        if (rhs.data != NULL) {
            rhs.data->AddRef();
        }
        if (data != NULL) {
            data->Release();
        }
        data = rhs.data;
        return *this;
    }